

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall Tjen::Node::editStack(Node *this,string *newTop)

{
  iterator *piVar1;
  char *pcVar2;
  int iVar3;
  int i;
  ulong uVar4;
  char t;
  char local_29;
  
  iVar3 = std::__cxx11::string::compare((char *)newTop);
  if (iVar3 != 0) {
    if (1 < newTop->_M_string_length) {
      uVar4 = 0;
      do {
        local_29 = *(newTop->_M_dataplus)._M_p;
        pcVar2 = (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (pcVar2 == (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&this->stack,&local_29);
        }
        else {
          *pcVar2 = local_29;
          piVar1 = &(this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < newTop->_M_string_length - 1);
    }
    return;
  }
  std::deque<char,_std::allocator<char>_>::pop_back(&(this->stack).c);
  return;
}

Assistant:

void Tjen::Node::editStack( const std::string &newTop) {
    if(newTop == "ε"){
        stack.pop();

    }else if(newTop.size() >= 2){
        for (int i = 0; i < newTop.size()-1; ++i) {
            char t = newTop[0];
            stack.push(t);
        }

    }
}